

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_test.c
# Opt level: O0

void test_req_resend_reconnect(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  bool bVar4;
  undefined4 uVar5;
  nng_err result__17;
  nng_err result__16;
  int rv__2;
  size_t sz__2;
  char buf__2 [64];
  nng_err result__15;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__14;
  nng_err result__13;
  int rv_;
  size_t sz_;
  char buf_ [64];
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_socket rep2;
  nng_socket rep1;
  nng_socket req;
  
  nVar1 = nng_req0_open(&rep2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd2,"%s: expected success, got %s (%d)","nng_req0_open(&req)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_rep0_open((nng_socket *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd3,"%s: expected success, got %s (%d)","nng_rep0_open(&rep1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_rep0_open((nng_socket *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd4,"%s: expected success, got %s (%d)","nng_rep0_open(&rep2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(rep2,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd6,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result_,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd7,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep1, NNG_OPT_RECVTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result__1,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd8,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep2, NNG_OPT_RECVTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(rep2,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd9,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xda,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep1, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result__1,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xdb,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep2, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(rep2,"req:resend-time",60000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xde,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTIME, 60 * SECOND)",pcVar3,nVar1)
  ;
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(rep2,"req:resend-tick",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xe0,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTICK, SECOND / 10)",pcVar3,nVar1)
  ;
  if (iVar2 == 0) {
    acutest_abort_();
  }
  buf_._60_4_ = nuts_marry((nng_socket)result_,rep2);
  bVar4 = buf_._60_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf_._60_4_);
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xe2,"%s: expected success, got %s (%d)","nuts_marry(rep1, req)",pcVar3,
                         buf_._60_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  buf_._56_4_ = nng_send(rep2,"ping",5,0);
  bVar4 = buf_._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf_._56_4_);
  uVar5 = buf_._56_4_;
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xe4,"%s: expected success, got %s (%d)",
                         "nng_send(req, \"ping\", strlen(\"ping\") + 1, 0)",pcVar3,buf_._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__13 = 0x40;
  nVar1 = nng_recv((nng_socket)result_,&sz_,(size_t *)&result__13,0);
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xe5,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
  acutest_check_((uint)(_result__13 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xe5,"length %d want %d",_result__13 & 0xffffffff,5);
  buf_[0x37] = '\0';
  iVar2 = strcmp("ping",(char *)&sz_);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xe5,"%s == %s","ping",&sz_);
  nVar1 = nng_socket_close((nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xe7,"%s: expected success, got %s (%d)","nng_socket_close(rep1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry((nng_socket)result__1,rep2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xe8,"%s: expected success, got %s (%d)","nuts_marry(rep2, req)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__15 = 0x40;
  num = nng_recv((nng_socket)result__1,&sz__1,(size_t *)&result__15,0);
  buf__2._60_4_ = num;
  pcVar3 = nng_strerror(num);
  acutest_check_((uint)(num == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xea,"nng_recv (%d %s)",(ulong)num,pcVar3,nVar1);
  acutest_check_((uint)(_result__15 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xea,"length %d want %d",_result__15 & 0xffffffff,5);
  buf__1[0x37] = '\0';
  iVar2 = strcmp("ping",(char *)&sz__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xea,"%s == %s","ping",&sz__1);
  buf__2._56_4_ = nng_send((nng_socket)result__1,"rep2",5,0);
  bVar4 = buf__2._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf__2._56_4_);
  uVar5 = buf__2._56_4_;
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xeb,"%s: expected success, got %s (%d)",
                         "nng_send(rep2, \"rep2\", strlen(\"rep2\") + 1, 0)",pcVar3,buf__2._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__16 = 0x40;
  nVar1 = nng_recv(rep2,&sz__2,(size_t *)&result__16,0);
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xec,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
  acutest_check_((uint)(_result__16 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xec,"length %d want %d",_result__16 & 0xffffffff,5);
  buf__2[0x37] = '\0';
  iVar2 = strcmp("rep2",(char *)&sz__2);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                 ,0xec,"%s == %s","rep2",&sz__2);
  nVar1 = nng_socket_close(rep2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xee,"%s: expected success, got %s (%d)","nng_socket_close(req)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xef,"%s: expected success, got %s (%d)","nng_socket_close(rep2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_req_resend_reconnect(void)
{
	nng_socket req;
	nng_socket rep1;
	nng_socket rep2;

	NUTS_PASS(nng_req0_open(&req));
	NUTS_PASS(nng_rep0_open(&rep1));
	NUTS_PASS(nng_rep0_open(&rep2));

	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep1, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep2, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep1, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep2, NNG_OPT_SENDTIMEO, SECOND));
	// We intentionally set the retry time long; that way we only see
	// the retry from loss of our original peer.
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTIME, 60 * SECOND));
	// And make sure the tick runs faster than our timeout!
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTICK, SECOND / 10));

	NUTS_MARRY(rep1, req);

	NUTS_SEND(req, "ping");
	NUTS_RECV(rep1, "ping");

	NUTS_CLOSE(rep1);
	NUTS_MARRY(rep2, req);

	NUTS_RECV(rep2, "ping");
	NUTS_SEND(rep2, "rep2");
	NUTS_RECV(req, "rep2");

	NUTS_CLOSE(req);
	NUTS_CLOSE(rep2);
}